

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

mapped_type * __thiscall
wasm::
getModuleElement<std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>>
          (wasm *this,
          unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
          *m,Name name,string *funcName)

{
  bool bVar1;
  Fatal *pFVar2;
  pointer ppVar3;
  Fatal local_1c0;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Export_*>,_true> local_38;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Export_*>,_true> local_30;
  iterator iter;
  string *funcName_local;
  unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
  *m_local;
  Name name_local;
  
  iter.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Export_*>,_true>._M_cur =
       name.super_IString.str._M_str;
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  m_local = m;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
       ::find((unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
               *)this,(key_type *)&m_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
       ::end((unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
              *)this);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (!bVar1) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Export_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Export_*>,_false,_true>
                           *)&local_30);
    return &ppVar3->second;
  }
  Fatal::Fatal(&local_1c0);
  pFVar2 = Fatal::operator<<(&local_1c0,(char (*) [9])"Module::");
  pFVar2 = Fatal::operator<<(pFVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)iter.
                                       super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Export_*>,_true>
                                       ._M_cur);
  pFVar2 = Fatal::operator<<(pFVar2,(char (*) [3])0x20e97ba);
  pFVar2 = Fatal::operator<<(pFVar2,(Name *)&m_local);
  Fatal::operator<<(pFVar2,(char (*) [16])" does not exist");
  Fatal::~Fatal(&local_1c0);
}

Assistant:

typename Map::mapped_type&
getModuleElement(Map& m, Name name, const std::string& funcName) {
  auto iter = m.find(name);
  if (iter == m.end()) {
    Fatal() << "Module::" << funcName << ": " << name << " does not exist";
  }
  return iter->second;
}